

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

bool __thiscall Catch::ResultInfo::hasExpandedExpression(ResultInfo *this)

{
  bool bVar1;
  string local_30;
  
  if ((this->m_expr)._M_string_length == 0) {
    bVar1 = false;
  }
  else {
    getExpandedExpressionInternal_abi_cxx11_(&local_30,this);
    bVar1 = std::operator!=(&local_30,&this->m_expr);
    std::__cxx11::string::~string((string *)&local_30);
  }
  return bVar1;
}

Assistant:

Expression<const T&> operator->* ( const T & operand ) {
        Expression<const T&> expr( m_result, operand );
        return expr;
    }